

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
RtApi::getDeviceIds(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   RtApi *this)

{
  iterator __position;
  long lVar1;
  pointer pDVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  (*this->_vptr_RtApi[0xb])(this);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar2 = (this->deviceList_).
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->deviceList_).
      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish != pDVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,&pDVar2[uVar3].ID);
      }
      else {
        *__position._M_current = pDVar2[uVar3].ID;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pDVar2 = (this->deviceList_).
               super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->deviceList_).
                     super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 5) *
              -0x5555555555555555;
      bVar5 = uVar4 <= uVar3;
      lVar1 = uVar3 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> RtApi :: getDeviceIds( void )
{
  probeDevices();

  // Copy device IDs into output vector.
  std::vector<unsigned int> deviceIds;
  for ( unsigned int m=0; m<deviceList_.size(); m++ )
    deviceIds.push_back( deviceList_[m].ID );

  return deviceIds;
}